

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_layer2.c
# Opt level: O1

oonf_layer2_neigh * oonf_layer2_neigh_add_lid(oonf_layer2_net *l2net,oonf_layer2_neigh_key *key)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  long lVar8;
  oonf_layer2_neigh *ptr;
  
  if ((byte)((key->addr)._type - 0x2f) < 2) {
    lVar8 = avl_find(&l2net->neighbors);
    if (lVar8 != 0) {
      return (oonf_layer2_neigh *)(lVar8 + -0x4c0);
    }
    ptr = (oonf_layer2_neigh *)oonf_class_malloc(&_l2neighbor_class);
    if (ptr != (oonf_layer2_neigh *)0x0) {
      *(undefined4 *)((ptr->key).link_id + 0xc) = *(undefined4 *)(key->link_id + 0xc);
      uVar1 = *(undefined4 *)(key->addr)._addr;
      uVar2 = *(undefined4 *)((key->addr)._addr + 4);
      uVar3 = *(undefined4 *)((key->addr)._addr + 8);
      uVar4 = *(undefined4 *)((key->addr)._addr + 0xc);
      uVar5 = *(undefined4 *)(key->link_id + 1);
      uVar6 = *(undefined4 *)(key->link_id + 5);
      uVar7 = *(undefined4 *)(key->link_id + 9);
      *(undefined4 *)&(ptr->key).addr._type = *(undefined4 *)&(key->addr)._type;
      *(undefined4 *)((ptr->key).link_id + 1) = uVar5;
      *(undefined4 *)((ptr->key).link_id + 5) = uVar6;
      *(undefined4 *)((ptr->key).link_id + 9) = uVar7;
      *(undefined4 *)(ptr->key).addr._addr = uVar1;
      *(undefined4 *)((ptr->key).addr._addr + 4) = uVar2;
      *(undefined4 *)((ptr->key).addr._addr + 8) = uVar3;
      *(undefined4 *)((ptr->key).addr._addr + 0xc) = uVar4;
      (ptr->_node).key = ptr;
      ptr->network = l2net;
      avl_insert(&l2net->neighbors,&ptr->_node);
      lVar8 = 0;
      avl_init(&ptr->destinations,avl_comp_netaddr,0);
      avl_init(&ptr->remote_neighbor_ips,avl_comp_netaddr,0);
      do {
        *(char **)((long)&ptr->data[0]._meta + lVar8) = _metadata_neigh[0].key + lVar8;
        lVar8 = lVar8 + 0x28;
      } while (lVar8 != 0x410);
      oonf_class_event(&_l2neighbor_class,ptr,OONF_OBJECT_ADDED);
      return ptr;
    }
  }
  return (oonf_layer2_neigh *)0x0;
}

Assistant:

struct oonf_layer2_neigh *
oonf_layer2_neigh_add_lid(struct oonf_layer2_net *l2net, const struct oonf_layer2_neigh_key *key) {
  struct oonf_layer2_neigh *l2neigh;
  enum oonf_layer2_neighbor_index neighidx;

  if (netaddr_get_address_family(&key->addr) != AF_MAC48 && netaddr_get_address_family(&key->addr) != AF_EUI64) {
    return NULL;
  }

  l2neigh = oonf_layer2_neigh_get_lid(l2net, key);
  if (l2neigh) {
    return l2neigh;
  }

  l2neigh = oonf_class_malloc(&_l2neighbor_class);
  if (!l2neigh) {
    return NULL;
  }

  memcpy(&l2neigh->key, key, sizeof(*key));
  l2neigh->_node.key = &l2neigh->key;
  l2neigh->network = l2net;

  avl_insert(&l2net->neighbors, &l2neigh->_node);

  avl_init(&l2neigh->destinations, avl_comp_netaddr, false);
  avl_init(&l2neigh->remote_neighbor_ips, avl_comp_netaddr, false);

  /* initialize metadata */
  for (neighidx=0; neighidx<OONF_LAYER2_NEIGH_COUNT; neighidx++) {
    l2neigh->data[neighidx]._meta = oonf_layer2_neigh_metadata_get(neighidx);
  }

  oonf_class_event(&_l2neighbor_class, l2neigh, OONF_OBJECT_ADDED);

  return l2neigh;
}